

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O3

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::polyline
          (ImGuiDrawListGraphicsAdaptor *this,
          vector<nivalis::point,_std::allocator<nivalis::point>_> *points,color *c,float thickness,
          bool closed,bool fill)

{
  pointer ppVar1;
  ImDrawList *pIVar2;
  long lVar3;
  point *points_00;
  undefined1 this_00 [8];
  ImU32 IVar4;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX_00;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *poly;
  pointer puVar5;
  undefined7 in_register_00000081;
  ulong uVar6;
  point *p;
  pointer ppVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  undefined1 local_88 [8];
  pointer local_80;
  pointer local_78;
  undefined1 local_70 [8];
  undefined8 local_68;
  vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *local_60;
  ImVec4 local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((int)CONCAT71(in_register_00000081,fill) == 0) {
    pIVar2 = this->draw_list;
    points_00 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ppVar7 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_70._4_4_ = *c->g;
    local_70._0_4_ = *c->r;
    local_68 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
               CONCAT44(*c->a,*c->b);
    IVar4 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_70);
    ImDrawList::AddPolyline<nivalis::point>
              (pIVar2,points_00,(int)((ulong)((long)ppVar7 - (long)points_00) >> 3) * -0x55555555,
               IVar4,closed,thickness);
  }
  else {
    local_70 = (undefined1  [8])operator_new(0x18);
    local_68 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
               ((long)local_70 + 0x18);
    *(long *)local_70 = 0;
    *(long *)((long)local_70 + 8) = 0;
    *(long *)((long)local_70 + 0x10) = 0;
    ppVar7 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ppVar1 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    poly = extraout_RDX;
    local_60 = local_68;
    if (ppVar7 != ppVar1) {
      do {
        this_00 = local_70;
        local_88._0_4_ = point::operator[](ppVar7,0);
        local_88._4_4_ = point::operator[](ppVar7,1);
        std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
        emplace_back<std::array<float,2ul>>
                  ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)this_00,
                   (array<float,_2UL> *)local_88);
        ppVar7 = ppVar7 + 1;
        poly = extraout_RDX_00;
      } while (ppVar7 != ppVar1);
    }
    mapbox::
    earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,(mapbox *)local_70,
               poly);
    puVar5 = (pointer)CONCAT44(local_88._4_4_,local_88._0_4_);
    if (local_80 != puVar5) {
      uVar6 = 0;
      do {
        pIVar2 = this->draw_list;
        lVar3 = *(long *)local_70;
        local_38 = *(ImVec2 *)(lVar3 + (ulong)puVar5[uVar6] * 8);
        local_40 = *(ImVec2 *)(lVar3 + (ulong)puVar5[uVar6 + 1] * 8);
        local_48 = *(ImVec2 *)(lVar3 + (ulong)puVar5[uVar6 + 2] * 8);
        local_58.x = *c->r;
        local_58.y = *c->g;
        local_58.z = *c->b;
        local_58.w = *c->a;
        IVar4 = ImGui::ColorConvertFloat4ToU32(&local_58);
        ImDrawList::AddTriangleFilled(pIVar2,&local_38,&local_40,&local_48,IVar4);
        uVar6 = uVar6 + 3;
        puVar5 = (pointer)CONCAT44(local_88._4_4_,local_88._0_4_);
      } while (uVar6 < (ulong)((long)local_80 - (long)puVar5 >> 2));
    }
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5,(long)local_78 - (long)puVar5);
    }
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::~vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               *)local_70);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::polyline(const std::vector<point>& points,
                                            const color::color& c,
                                            float thickness, bool closed,
                                            bool fill) {
    if (fill) {
        std::vector<std::vector<ECPoint>> poly(1);
        for (auto& p : points) poly[0].push_back({p[0], p[1]});
        std::vector<ECInt> indices = mapbox::earcut<ECInt>(poly);
        for (size_t t = 0; t < indices.size(); t += 3) {
            const auto i = indices[t], j = indices[t + 1], k = indices[t + 2];
            draw_list->AddTriangleFilled(ImVec2(poly[0][i][0], poly[0][i][1]),
                                         ImVec2(poly[0][j][0], poly[0][j][1]),
                                         ImVec2(poly[0][k][0], poly[0][k][1]),
                                         ImColor(c.r, c.g, c.b, c.a));
        }
    } else {
        draw_list->AddPolyline<point>(&points[0], points.size(),
                                      ImColor(c.r, c.g, c.b, c.a), closed,
                                      thickness);
    }
}